

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::initRep(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,Representation p_rep)

{
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int32_t iVar5;
  int iVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  undefined4 extraout_var;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar12;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar13;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar14;
  
  this->theRep = p_rep;
  pUVar1 = &this->addVec;
  if (p_rep == COLUMN) {
    this->thevectors =
         &(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    this->thecovectors =
         (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
    this->theFrhs = &this->primRhs;
    this->theFvec = &this->primVec;
    this->theCoPrhs = &this->dualRhs;
    pUVar12 = &this->dualVec;
    lVar8 = 0x9c8;
    lVar9 = 0x9b0;
    lVar10 = 0x9f8;
    lVar11 = 0x9e0;
    pUVar13 = pUVar12;
    pUVar14 = pUVar1;
  }
  else {
    this->thevectors =
         (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
    this->thecovectors =
         &(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    this->theFrhs = &this->dualRhs;
    this->theFvec = &this->dualVec;
    this->theCoPrhs = &this->primRhs;
    pUVar12 = &this->primVec;
    lVar8 = 0x9f8;
    lVar9 = 0x9e0;
    lVar10 = 0x9c8;
    lVar11 = 0x9b0;
    pUVar13 = pUVar1;
    pUVar14 = pUVar12;
  }
  this->theCoPvec = pUVar12;
  this->thePvec = pUVar1;
  this->theRPvec = pUVar13;
  this->theCPvec = pUVar14;
  this->theUbound =
       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)((long)&(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray + lVar11);
  this->theLbound =
       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)((long)&(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray + lVar10);
  this->theCoUbound =
       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)((long)&(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray + lVar9);
  this->theCoLbound =
       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)((long)&(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray + lVar8);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x77])(this);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x79])(this);
  pcVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
  uVar2 = *(undefined8 *)((pcVar7->data)._M_elems + 2);
  uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 4);
  uVar4 = *(undefined8 *)((pcVar7->data)._M_elems + 6);
  *(undefined8 *)(this->m_nonbasicValue).m_backend.data._M_elems =
       *(undefined8 *)(pcVar7->data)._M_elems;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 2) = uVar2;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 4) = uVar3;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 6) = uVar4;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 8) =
       *(undefined8 *)((pcVar7->data)._M_elems + 8);
  (this->m_nonbasicValue).m_backend.exp = pcVar7->exp;
  (this->m_nonbasicValue).m_backend.neg = pcVar7->neg;
  iVar5 = pcVar7->prec_elem;
  (this->m_nonbasicValue).m_backend.fpclass = pcVar7->fpclass;
  (this->m_nonbasicValue).m_backend.prec_elem = iVar5;
  this->m_nonbasicValueUpToDate = false;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setRep(&this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          );
  if (NO_PROBLEM <
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus) {
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::loadDesc(&this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,&(this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc);
  }
  if (this->thepricer !=
      (SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    iVar6 = (*this->thepricer->_vptr_SPxPricer[3])();
    if ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT44(extraout_var,iVar6) == this) {
      (*this->thepricer->_vptr_SPxPricer[8])(this->thepricer,p_rep);
      return;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::initRep(Representation p_rep)
   {
      theRep = p_rep;

      if(theRep == COLUMN)
      {
         thevectors   = this->colSet();
         thecovectors = this->rowSet();
         theFrhs      = &primRhs;
         theFvec      = &primVec;
         theCoPrhs    = &dualRhs;
         theCoPvec    = &dualVec;
         thePvec      = &addVec;
         theRPvec     = theCoPvec;
         theCPvec     = thePvec;
         theUbound    = &theUCbound;
         theLbound    = &theLCbound;
         theCoUbound  = &theURbound;
         theCoLbound  = &theLRbound;
      }
      else
      {
         assert(theRep == ROW);

         thevectors   = this->rowSet();
         thecovectors = this->colSet();
         theFrhs      = &dualRhs;
         theFvec      = &dualVec;
         theCoPrhs    = &primRhs;
         theCoPvec    = &primVec;
         thePvec      = &addVec;
         theRPvec     = thePvec;
         theCPvec     = theCoPvec;
         theUbound    = &theURbound;
         theLbound    = &theLRbound;
         theCoUbound  = &theUCbound;
         theCoLbound  = &theLCbound;
      }

      unInit();
      reDim();

      forceRecompNonbasicValue();

      SPxBasisBase<R>::setRep();

      if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
         SPxBasisBase<R>::loadDesc(this->desc());

      if(thepricer && thepricer->solver() == this)
         thepricer->setRep(p_rep);
   }